

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O1

int v_scroll_layout_formula_proc(Am_Object *self)

{
  int value;
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Slot_Key key;
  int value_00;
  bool bVar4;
  Am_Widget_Look look;
  Am_Object arrow2;
  Am_Object arrow1;
  Am_Object indicator;
  Am_Widget_Look local_44;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  
  key = (Am_Slot_Key)self;
  Am_Object::Get_Object(&local_38,key,0x1b5);
  Am_Object::Get_Object(&local_40,key,0x1b6);
  Am_Object::Get_Object(&local_30,key,0x1b7);
  pAVar3 = Am_Object::Get(self,0x66,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(self,0x67,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(self,0x17f,0);
  local_44.value = Am_MOTIF_LOOK_val;
  if ((pAVar3->type != 1) && (pAVar3->type != Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError(&local_44,pAVar3);
  }
  local_44.value = (Am_Widget_Look_vals)(pAVar3->value).float_value;
  bVar4 = Am_MOTIF_LOOK.value == local_44.value;
  value_00 = (uint)bVar4 * 4;
  Am_Object::Set(&local_38,100,value_00,0);
  Am_Object::Set(&local_38,0x65,value_00,0);
  iVar1 = iVar1 + (uint)bVar4 * -8;
  Am_Object::Set(&local_38,0x66,iVar1,0);
  Am_Object::Set(&local_38,0x67,iVar1,0);
  Am_Object::Set(&local_40,100,value_00,0);
  value = iVar1 + value_00;
  Am_Object::Set(&local_40,0x65,iVar2 - value,0);
  Am_Object::Set(&local_40,0x66,iVar1,0);
  Am_Object::Set(&local_40,0x67,iVar1,0);
  if (local_44.value == Am_MOTIF_LOOK.value) {
    Am_Object::Set(self,0x1b2,value + 1,0);
    iVar2 = iVar2 + -2;
  }
  else {
    Am_Object::Set(self,0x1b2,value,0);
  }
  Am_Object::Set(self,0x1b4,iVar2 + value * -2,0);
  bVar4 = Am_Object::Valid(&local_30);
  if (bVar4) {
    Am_Object::Set(&local_30,100,value_00,0);
    Am_Object::Set(&local_30,0x66,iVar1,0);
  }
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_38);
  return 0;
}

Assistant:

Am_Define_Formula(int, v_scroll_layout_formula)
{
  Am_Object arrow1 = self.Get_Object(Am_SCROLL_ARROW1);
  Am_Object arrow2 = self.Get_Object(Am_SCROLL_ARROW2);
  Am_Object indicator = self.Get_Object(Am_SCROLL_INDICATOR);
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  // 2 for key selected and 2 for box
  int border = (look == Am_MOTIF_LOOK) ? 4 : 0;
  int arrow_size = width - 2 * border;

  arrow1.Set(Am_LEFT, border);
  arrow1.Set(Am_TOP, border);
  arrow1.Set(Am_WIDTH, arrow_size);
  arrow1.Set(Am_HEIGHT, arrow_size); // square

  arrow2.Set(Am_LEFT, border);
  arrow2.Set(Am_TOP, height - arrow_size - border); // minus size of arrows
  arrow2.Set(Am_WIDTH, arrow_size);
  arrow2.Set(Am_HEIGHT, arrow_size); // square

  if (look == Am_MOTIF_LOOK) { // bottom of top arrow
    self.Set(Am_SCROLL_AREA_MIN, arrow_size + border + 1);
    self.Set(Am_SCROLL_AREA_SIZE, height - 2 * arrow_size - 2 * border - 2);
  } else {
    self.Set(Am_SCROLL_AREA_MIN, arrow_size + border); // bottom of top arrow
    self.Set(Am_SCROLL_AREA_SIZE, height - 2 * arrow_size - 2 * border);
  }
  if (indicator.Valid()) { //no indicator for Am_Vertical_Up_Down_Counter
    indicator.Set(Am_LEFT, border);
    indicator.Set(Am_WIDTH, width - 2 * border);
  }
  return 0; // return value not used
}